

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::sendForPipelineInternal(RpcRequest *this)

{
  uint *puVar1;
  RpcConnectionState *pRVar2;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar3;
  long lVar4;
  long *plVar5;
  uint *puVar6;
  size_t sVar7;
  ArrayDisposer *pAVar8;
  QuestionId *pQVar9;
  Builder payload;
  int *piVar10;
  RemoveConst<int> *pRVar11;
  int *piVar12;
  Question *pQVar13;
  QuestionRef *pQVar14;
  QuestionRef *extraout_RDX;
  QuestionRef *extraout_RDX_00;
  QuestionRef *extraout_RDX_01;
  long in_RSI;
  Refcounted *refcounted;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> OVar15;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  QuestionId questionId;
  Vector<int> fds;
  Array<unsigned_int> exports;
  Array<int> result;
  anon_class_8_1_8991fb9c _kjContextFunc2680;
  UnwindDetector _kjUnwindDetector2673;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2679:7)>
  _kjContext2680;
  QuestionId local_13c;
  Vector<int> local_138;
  Array<unsigned_int> local_118;
  int *local_f8;
  long lStack_f0;
  ArrayDisposer *local_e8;
  undefined1 local_d8 [12];
  UnwindDetector local_cc;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2670:7)>
  local_c8;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_a8;
  StructBuilder local_a0;
  undefined1 local_78 [72];
  undefined1 *local_30;
  
  local_138.builder.ptr = (int *)0x0;
  local_138.builder.pos = (RemoveConst<int> *)0x0;
  local_138.builder.endPtr = (RemoveConst<int> *)0x0;
  local_138.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  pRVar2 = *(RpcConnectionState **)(in_RSI + 0x18);
  pMVar3 = *(Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> **)(in_RSI + 0x48);
  lVar4 = *(long *)(in_RSI + 0x50);
  local_78._0_8_ = *(undefined8 *)(in_RSI + 0x68);
  local_78._8_8_ = *(undefined8 *)(in_RSI + 0x70);
  local_78._16_8_ = *(long *)(in_RSI + 0x80) + 8;
  PointerBuilder::getStruct(&local_a0,(PointerBuilder *)local_78,(StructSize)0x20000,(word *)0x0);
  local_a8.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  payload._builder.capTable = local_a0.capTable;
  payload._builder.segment = local_a0.segment;
  payload._builder.data = local_a0.data;
  payload._builder.pointers = local_a0.pointers;
  payload._builder.dataSize = local_a0.dataSize;
  payload._builder.pointerCount = local_a0.pointerCount;
  payload._builder._38_2_ = local_a0._38_2_;
  capTable.size_ = lVar4 - (long)pMVar3 >> 4;
  capTable.ptr = pMVar3;
  writeDescriptors(&local_118,pRVar2,capTable,payload,&local_138,&local_a8);
  plVar5 = *(long **)(in_RSI + 0x38);
  if (local_138.builder.pos != local_138.builder.endPtr) {
    kj::Vector<int>::setCapacity
              (&local_138,(long)local_138.builder.pos - (long)local_138.builder.ptr >> 2);
  }
  lStack_f0 = (long)local_138.builder.pos - (long)local_138.builder.ptr >> 2;
  local_f8 = local_138.builder.ptr;
  local_e8 = local_138.builder.disposer;
  local_138.builder.ptr = (int *)0x0;
  local_138.builder.pos = (RemoveConst<int> *)0x0;
  local_138.builder.endPtr = (int *)0x0;
  (**(code **)(*plVar5 + 8))(plVar5);
  lVar4 = lStack_f0;
  piVar10 = local_f8;
  if (local_f8 != (int *)0x0) {
    local_f8 = (int *)0x0;
    lStack_f0 = 0;
    (**local_e8->_vptr_ArrayDisposer)(local_e8,piVar10,4,lVar4,lVar4,0);
  }
  if (local_118.size_ != 0) {
    *(undefined1 *)(*(long *)(in_RSI + 0x18) + 0xb41) = 1;
  }
  pQVar13 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::
            nextHigh((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>
                      *)(*(long *)(in_RSI + 0x18) + 0x248),&local_13c);
  pQVar13->isAwaitingReturn = false;
  puVar6 = (pQVar13->paramExports).ptr;
  if (puVar6 != (uint *)0x0) {
    sVar7 = (pQVar13->paramExports).size_;
    pAVar8 = (pQVar13->paramExports).disposer;
    (pQVar13->paramExports).ptr = (uint *)0x0;
    (pQVar13->paramExports).size_ = 0;
    (**pAVar8->_vptr_ArrayDisposer)(pAVar8,puVar6,4,sVar7,sVar7,0);
  }
  (pQVar13->paramExports).ptr = local_118.ptr;
  (pQVar13->paramExports).size_ = local_118.size_;
  (pQVar13->paramExports).disposer = local_118.disposer;
  local_118.ptr = (uint *)0x0;
  local_118.size_ = 0;
  pQVar13->isTailCall = false;
  pRVar2 = *(RpcConnectionState **)(in_RSI + 0x18);
  pQVar14 = (QuestionRef *)operator_new(0x38);
  (pQVar14->super_Refcounted).refcount = 0;
  (pQVar14->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006f9b48;
  puVar1 = &(pRVar2->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (pQVar14->connectionState).ptr.disposer = &(pRVar2->super_Refcounted).super_Disposer;
  (pQVar14->connectionState).ptr.ptr = pRVar2;
  pQVar14->id = local_13c;
  (pQVar14->fulfiller).ptr.disposer = (Disposer *)0x0;
  (pQVar14->fulfiller).ptr.ptr =
       (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
        *)0x0;
  (pQVar14->super_Refcounted).refcount = 1;
  (pQVar13->selfRef).ptr = pQVar14;
  kj::UnwindDetector::UnwindDetector(&local_cc);
  local_c8.maybeFunc.ptr.isSet = true;
  pQVar9 = *(QuestionId **)(in_RSI + 0x78);
  *pQVar9 = local_13c;
  pQVar9 = pQVar9 + 4;
  *(byte *)pQVar9 = (byte)*pQVar9 | 4;
  local_c8.maybeFunc.ptr.field_1.value._kjUnwindDetector2673 = &local_cc;
  local_c8.maybeFunc.ptr.field_1.value.question = pQVar13;
  kj::_::Debug::Context::Context((Context *)local_78);
  local_78._0_8_ = &PTR__Context_006fa310;
  local_30 = local_d8;
  (**(code **)(**(long **)(in_RSI + 0x38) + 0x10))();
  (this->super_RequestHook)._vptr_RequestHook = (_func_int **)pQVar14;
  (this->super_RequestHook).brand = pQVar14;
  kj::_::Debug::Context::~Context((Context *)local_78);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++:2670:7)>
  ::run(&local_c8);
  sVar7 = local_118.size_;
  puVar6 = local_118.ptr;
  pQVar14 = extraout_RDX;
  if (local_118.ptr != (uint *)0x0) {
    local_118.ptr = (uint *)0x0;
    local_118.size_ = 0;
    (**(local_118.disposer)->_vptr_ArrayDisposer)(local_118.disposer,puVar6,4,sVar7,sVar7,0);
    pQVar14 = extraout_RDX_00;
  }
  piVar12 = local_138.builder.endPtr;
  pRVar11 = local_138.builder.pos;
  piVar10 = local_138.builder.ptr;
  if (local_138.builder.ptr != (int *)0x0) {
    local_138.builder.ptr = (int *)0x0;
    local_138.builder.pos = (RemoveConst<int> *)0x0;
    local_138.builder.endPtr = (int *)0x0;
    (**(local_138.builder.disposer)->_vptr_ArrayDisposer)
              (local_138.builder.disposer,piVar10,4,(long)pRVar11 - (long)piVar10 >> 2,
               (long)piVar12 - (long)piVar10 >> 2,0);
    pQVar14 = extraout_RDX_01;
  }
  OVar15.ptr = pQVar14;
  OVar15.disposer = (Disposer *)this;
  return OVar15;
}

Assistant:

kj::Own<QuestionRef> sendForPipelineInternal() {
      // Since must of setupSend() is subtly different for this case, we don't reuse it.

      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      if (exports.size() > 0) {
        connectionState->sentCapabilitiesInPipelineOnlyCall = true;
      }

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      question.paramExports = kj::mv(exports);
      question.isTailCall = false;

      // Make the QuestionRef and result promise.
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      // If sending throws, we'll need to fix up the state a little...
      KJ_ON_SCOPE_FAILURE({
        question.skipFinish = true;
        connectionState->releaseExports(question.paramExports);
      });

      // Finish and send.
      callBuilder.setQuestionId(questionId);
      callBuilder.setOnlyPromisePipeline(true);

      KJ_CONTEXT("sending RPC call",
          callBuilder.getInterfaceId(), callBuilder.getMethodId());
      message->send();

      return kj::mv(questionRef);
    }